

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
vkt::geometry::anon_unknown_0::GeometryOutputCountTest::initPrograms
          (GeometryOutputCountTest *this,SourceCollections *sourceCollections)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ProgramSources *pPVar3;
  int *piVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  ostringstream src;
  string local_210;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  uint local_1d0;
  value_type local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 1) in highp vec4 a_color;\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out highp vec4 v_geom_FragColor;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tv_geom_FragColor = a_color;\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vertex","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_210);
  std::__cxx11::stringbuf::str();
  local_1d0 = 0;
  paVar1 = &local_1c8.field_2;
  local_1c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_1f0,local_1e8 + (long)local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  piVar4 = (this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)(this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)piVar4 == 8) && (*piVar4 < piVar4[1])) {
    piVar4 = piVar4 + 1;
  }
  iVar2 = *piVar4;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#extension GL_EXT_geometry_shader : require\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "#extension GL_OES_texture_storage_multisample_2d_array : require\n",0x41);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(points) in;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(triangle_strip, max_vertices = ",0x26);
  poVar5 = (ostream *)std::ostream::operator<<(local_1a8,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") out;\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"layout(location = 0) in highp vec4 v_geom_FragColor[];\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"layout(location = 0) out highp vec4 v_frag_FragColor;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"\tconst highp float rowHeight = 2.0 / float(",0x2b);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"\tconst highp float colWidth = 2.0 / float(",0x2a);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
  pcVar7 = ");\n";
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
  if ((long)(this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\thighp int emitCount = (gl_PrimitiveIDIn == 0) ? (",0x32);
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (local_1a8,
                        *(this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,") : (",5);
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(this->m_pattern).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[1]);
    lVar6 = 3;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\thighp int emitCount = ",0x17);
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (local_1a8,
                        *(this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    lVar6 = 2;
    pcVar7 = ";\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,lVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tfor (highp int ndx = 0; ndx < emitCount / 2; ndx++)\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\t\tgl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, 0.0, 0.0, 0.0);\n"
             ,0x59);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\t\tv_frag_FragColor = v_geom_FragColor[0];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\t\tEmitVertex();\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\t\tgl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, rowHeight, 0.0, 0.0);\n"
             ,0x5f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\t\tv_frag_FragColor = v_geom_FragColor[0];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\t\tEmitVertex();\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\t}\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"geometry","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_210);
  std::__cxx11::stringbuf::str();
  local_1d0 = 2;
  local_1c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_1f0,local_1e8 + (long)local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 fragColor;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in highp vec4 v_frag_FragColor;\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tfragColor = v_frag_FragColor;\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"fragment","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_210);
  std::__cxx11::stringbuf::str();
  local_1d0 = 1;
  local_1c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_1f0,local_1e8 + (long)local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GeometryOutputCountTest::initPrograms (SourceCollections& sourceCollections) const
{
	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<<"layout(location = 0) in highp vec4 a_position;\n"
			<<"layout(location = 1) in highp vec4 a_color;\n"
			<<"layout(location = 0) out highp vec4 v_geom_FragColor;\n"
			<<"void main (void)\n"
			<<"{\n"
			<<"	gl_Position = a_position;\n"
			<<"	v_geom_FragColor = a_color;\n"
			<<"}\n";
		sourceCollections.glslSources.add("vertex") << glu::VertexSource(src.str());
	}

	{
		const int max_vertices = m_pattern.size() == 2 ? std::max(m_pattern[0], m_pattern[1]) : m_pattern[0];

		std::ostringstream src;
		src	<< "#version 310 es\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "#extension GL_OES_texture_storage_multisample_2d_array : require\n"
			<< "layout(points) in;\n"
			<< "layout(triangle_strip, max_vertices = " << max_vertices << ") out;\n"
			<< "layout(location = 0) in highp vec4 v_geom_FragColor[];\n"
			<< "layout(location = 0) out highp vec4 v_frag_FragColor;\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "	const highp float rowHeight = 2.0 / float(" << m_pattern.size() << ");\n"
			<< "	const highp float colWidth = 2.0 / float(" << max_vertices << ");\n";

		if (m_pattern.size() == 2)
			src	<< "	highp int emitCount = (gl_PrimitiveIDIn == 0) ? (" << m_pattern[0] << ") : (" << m_pattern[1] << ");\n";
		else
			src	<< "	highp int emitCount = " << m_pattern[0] << ";\n";
		src	<< "	for (highp int ndx = 0; ndx < emitCount / 2; ndx++)\n"
			<< "	{\n"
			<< "		gl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, 0.0, 0.0, 0.0);\n"
			<< "		v_frag_FragColor = v_geom_FragColor[0];\n"
			<< "		EmitVertex();\n"

			<< "		gl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, rowHeight, 0.0, 0.0);\n"
			<< "		v_frag_FragColor = v_geom_FragColor[0];\n"
			<< "		EmitVertex();\n"

			<< "	}\n"
			<< "}\n";
		sourceCollections.glslSources.add("geometry") << glu::GeometrySource(src.str());
	}

	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<<"layout(location = 0) out mediump vec4 fragColor;\n"
			<<"layout(location = 0) in highp vec4 v_frag_FragColor;\n"
			<<"void main (void)\n"
			<<"{\n"
			<<"	fragColor = v_frag_FragColor;\n"
			<<"}\n";
		sourceCollections.glslSources.add("fragment") << glu::FragmentSource(src.str());
	}
}